

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matdet.c
# Opt level: O0

double mat_cofact(MATRIX A,int i,int j)

{
  double dVar1;
  double dVar2;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  double dVar3;
  double result;
  undefined8 in_stack_ffffffffffffffe8;
  
  dVar1 = signa[(in_ESI + in_EDX) % 2];
  dVar2 = *(double *)(*(long *)(in_RDI + (long)in_ESI * 8) + (long)in_EDX * 8);
  dVar3 = mat_minor((MATRIX)CONCAT44(in_ESI,in_EDX),(int)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
                    (int)in_stack_ffffffffffffffe8);
  return dVar1 * dVar2 * dVar3;
}

Assistant:

double mat_cofact( MATRIX A, int i, int j )
{
	double	result;

	result = signa[(i+j)%2] * A[i][j] * mat_minor(A, i, j);

	return (result);
}